

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

bool __thiscall cppcms::form::iterator::equal(iterator *this,iterator *other)

{
  _Map_pointer ppuVar1;
  bool bVar2;
  _Deque_iterator<unsigned_int,_const_unsigned_int_&,_const_unsigned_int_*> local_90;
  _Deque_iterator<unsigned_int,_const_unsigned_int_&,_const_unsigned_int_*> local_70;
  _Deque_iterator<unsigned_int,_const_unsigned_int_&,_const_unsigned_int_*> local_50;
  
  if ((this->current_ == other->current_) && (this->offset_ == other->offset_)) {
    local_90._M_node =
         (this->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node;
    local_70._M_node =
         (this->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Deque_impl_data._M_start._M_node;
    local_90._M_cur =
         (this->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_90._M_first =
         (this->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_first;
    local_70._M_cur =
         (this->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_70._M_last =
         (this->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar1 = (other->return_positions_).c.
              super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    local_50._M_node =
         (other->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_50._M_cur =
         (other->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_50._M_last =
         (other->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    if (((long)local_70._M_last - (long)local_70._M_cur >> 2) +
        ((long)local_90._M_cur - (long)local_90._M_first >> 2) +
        ((((ulong)((long)local_90._M_node - (long)local_70._M_node) >> 3) - 1) +
        (ulong)(local_90._M_node == (_Map_pointer)0x0)) * 0x80 ==
        ((long)local_50._M_last - (long)local_50._M_cur >> 2) +
        ((long)(other->return_positions_).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(other->return_positions_).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 2) +
        ((((ulong)((long)ppuVar1 - (long)local_50._M_node) >> 3) - 1) +
        (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x80) {
      local_70._M_first =
           (this->return_positions_).c.
           super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
      local_90._M_last =
           (this->return_positions_).c.
           super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_last;
      local_50._M_first =
           (other->return_positions_).c.
           super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
      bVar2 = std::
              __equal_dit<unsigned_int,unsigned_int_const&,unsigned_int_const*,std::_Deque_iterator<unsigned_int,unsigned_int_const&,unsigned_int_const*>>
                        (&local_70,&local_90,&local_50);
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool form::iterator::equal(form::iterator const &other) const
{
	return 	current_ == other.current_ 
		&& offset_ == other.offset_
		&& return_positions_ == other.return_positions_;
}